

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O1

void resize(lua_State *L,Table *t,int nasize,int nhsize)

{
  byte bVar1;
  Node *block;
  TValue *pTVar2;
  TValue *pTVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  iVar5 = t->sizearray;
  bVar1 = t->lsizenode;
  block = t->node;
  if (iVar5 < nasize) {
    setarrayvector(L,t,nasize);
  }
  setnodevector(L,t,nhsize);
  if (nasize < iVar5) {
    t->sizearray = nasize;
    lVar6 = (long)nasize * 0x10 + 8;
    iVar4 = nasize + 1;
    do {
      pTVar3 = t->array;
      if (*(int *)((long)&pTVar3->value + lVar6) != 0) {
        pTVar2 = luaH_setnum(L,t,iVar4);
        pTVar2->value = *(Value *)((long)pTVar3 + lVar6 + -8);
        pTVar2->tt = *(int *)((long)&pTVar3->value + lVar6);
      }
      lVar6 = lVar6 + 0x10;
      bVar7 = iVar4 != iVar5;
      iVar4 = iVar4 + 1;
    } while (bVar7);
    if (nasize < -1) {
      pTVar3 = (TValue *)luaM_toobig(L);
    }
    else {
      pTVar3 = (TValue *)luaM_realloc_(L,t->array,(long)iVar5 << 4,(long)nasize * 0x10);
    }
    t->array = pTVar3;
  }
  iVar5 = 1 << (bVar1 & 0x1f);
  if (bVar1 != 0x1f) {
    iVar4 = iVar5 + 1;
    pTVar3 = (TValue *)&block[iVar5 - 1].i_key;
    do {
      if (pTVar3[-1].tt != 0) {
        pTVar2 = luaH_set(L,t,pTVar3);
        pTVar2->value = pTVar3[-1].value;
        pTVar2->tt = pTVar3[-1].tt;
      }
      iVar4 = iVar4 + -1;
      pTVar3 = (TValue *)&pTVar3[-3].tt;
    } while (1 < iVar4);
  }
  if (block != &dummynode_) {
    luaM_realloc_(L,block,(long)iVar5 * 0x28,0);
    return;
  }
  return;
}

Assistant:

static void resize (lua_State *L, Table *t, int nasize, int nhsize) {
  int i;
  int oldasize = t->sizearray;
  int oldhsize = t->lsizenode;
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  setnodevector(L, t, nhsize);  
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        setobjt2t(L, luaH_setnum(L, t, i+1), &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (i = twoto(oldhsize) - 1; i >= 0; i--) {
    Node *old = nold+i;
    if (!ttisnil(gval(old)))
      setobjt2t(L, luaH_set(L, t, key2tval(old)), gval(old));
  }
  if (nold != dummynode)
    luaM_freearray(L, nold, twoto(oldhsize), Node);  /* free old array */
}